

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O2

void __thiscall Stat_rendertimes::Stat_rendertimes(Stat_rendertimes *this)

{
  FStat::FStat(&this->super_FStat,"rendertimes");
  (this->super_FStat)._vptr_FStat = (_func_int **)&PTR__FStat_007c3918;
  return;
}

Assistant:

ADD_STAT(rendertimes)
{
	static FString buff;
	static int lasttime=0;
	int t=I_FPSTime();
	if (t-lasttime>1000) 
	{
		buff.Truncate(0);
		AppendRenderTimes(buff);
		lasttime=t;
	}
	return buff;
}